

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall capnp::_::BuilderArena::LocalCapTable::~LocalCapTable(LocalCapTable *this)

{
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar1;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar2;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar3;
  ArrayDisposer *pAVar4;
  
  pMVar1 = (this->capTable).builder.ptr;
  if (pMVar1 != (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
    pRVar2 = (this->capTable).builder.pos;
    pMVar3 = (this->capTable).builder.endPtr;
    (this->capTable).builder.ptr = (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    (this->capTable).builder.pos = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0;
    (this->capTable).builder.endPtr = (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    pAVar4 = (this->capTable).builder.disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pMVar1,0x10,(long)pRVar2 - (long)pMVar1 >> 4,(long)pMVar3 - (long)pMVar1 >> 4,
               kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>
               ::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }